

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,char,char_const*,char[18],std::__cxx11::string,char[4],std::__cxx11::string,char[3]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,char **args_2,char (*args_3) [18],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
                   char (*args_5) [4],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
                   char (*args_7) [3])

{
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char local_f0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  size_t local_c0;
  char *pcStack_b8;
  size_type local_b0;
  pointer local_a8;
  undefined8 local_a0;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  char (*local_78) [18];
  size_type local_70;
  pointer local_68;
  size_t local_60;
  char (*local_58) [4];
  size_type local_50;
  pointer local_48;
  size_t local_40;
  char (*local_38) [3];
  
  local_d0._M_len = (a->View_)._M_len;
  local_d0._M_str = (a->View_)._M_str;
  local_c0 = (b->View_)._M_len;
  pcStack_b8 = (b->View_)._M_str;
  local_a8 = (args->_M_dataplus)._M_p;
  local_b0 = args->_M_string_length;
  local_f0[0] = *args_1;
  local_98 = local_f0;
  local_a0 = 1;
  __s = *args_2;
  local_90 = strlen(__s);
  local_88 = __s;
  local_80 = strlen(*args_3);
  local_78 = args_3;
  local_68 = (args_4->_M_dataplus)._M_p;
  local_70 = args_4->_M_string_length;
  local_60 = strlen(*args_5);
  local_58 = args_5;
  local_48 = (args_6->_M_dataplus)._M_p;
  local_50 = args_6->_M_string_length;
  local_40 = strlen(*args_7);
  local_38 = args_7;
  views._M_len = 10;
  views._M_array = &local_d0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}